

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void TableSettingsHandler_ApplyAll(ImGuiContext *ctx,ImGuiSettingsHandler *param_2)

{
  uint uVar1;
  ImGuiTable *pIVar2;
  long lVar3;
  long lVar4;
  
  uVar1 = (ctx->Tables).Map.Data.Size;
  for (lVar3 = 0; (ulong)uVar1 << 4 != lVar3; lVar3 = lVar3 + 0x10) {
    pIVar2 = (ctx->Tables).Buf.Data;
    lVar4 = (long)*(int *)((long)&((ctx->Tables).Map.Data.Data)->field_1 + lVar3);
    if (pIVar2 != (ImGuiTable *)0x0 && lVar4 != -1) {
      pIVar2[lVar4].IsSettingsRequestLoad = true;
      pIVar2[lVar4].SettingsOffset = -1;
    }
  }
  return;
}

Assistant:

static void TableSettingsHandler_ApplyAll(ImGuiContext* ctx, ImGuiSettingsHandler*)
{
    ImGuiContext& g = *ctx;
    for (int i = 0; i != g.Tables.GetMapSize(); i++)
        if (ImGuiTable* table = g.Tables.TryGetMapData(i))
        {
            table->IsSettingsRequestLoad = true;
            table->SettingsOffset = -1;
        }
}